

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pipeline_private.hh
# Opt level: O0

unique_ptr<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_> __thiscall
qpdf::pl::create<qpdf::pl::String,std::__cxx11::string&>
          (pl *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_local;
  
  local_30.field_2._M_allocated_capacity = 0;
  local_30._M_dataplus = (_Alloc_hider)0x0;
  local_30._1_7_ = 0;
  local_30.field_2._8_8_ = args;
  args_local = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this;
  std::make_unique<qpdf::pl::String,char_const(&)[1],decltype(nullptr),std::__cxx11::string&>
            ((char (*) [1])&local_30._M_string_length,(void **)0x430c26,&local_30);
  std::
  make_unique<qpdf::pl::Link,decltype(nullptr),std::unique_ptr<qpdf::pl::String,std::default_delete<qpdf::pl::String>>>
            ((void **)this,
             (unique_ptr<qpdf::pl::String,_std::default_delete<qpdf::pl::String>_> *)
             &local_30.field_2._M_allocated_capacity);
  std::unique_ptr<qpdf::pl::String,_std::default_delete<qpdf::pl::String>_>::~unique_ptr
            ((unique_ptr<qpdf::pl::String,_std::default_delete<qpdf::pl::String>_> *)
             &local_30._M_string_length);
  return (__uniq_ptr_data<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>,_true,_true>)
         (__uniq_ptr_data<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Link>
    create(Args&&... args)
    {
        return std::make_unique<Link>(
            nullptr, std::make_unique<P>("", nullptr, std::forward<Args>(args)...));
    }